

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O3

void reallocCaptureBuf(void)

{
  size_t sVar1;
  LexerState *pLVar2;
  char *pcVar3;
  int *piVar4;
  size_t __size;
  char *fmt;
  
  pLVar2 = lexerState;
  sVar1 = lexerState->captureCapacity;
  if (sVar1 == 0xffffffffffffffff) {
    fmt = "Cannot grow capture buffer past %zu bytes\n";
    pcVar3 = (char *)0xffffffffffffffff;
  }
  else {
    __size = 0xffffffffffffffff;
    if (-1 < (long)sVar1) {
      __size = sVar1 * 2;
    }
    lexerState->captureCapacity = __size;
    pcVar3 = (char *)realloc(pLVar2->captureBuf,__size);
    lexerState->captureBuf = pcVar3;
    if (pcVar3 != (char *)0x0) {
      return;
    }
    piVar4 = __errno_location();
    pcVar3 = strerror(*piVar4);
    fmt = "realloc error while resizing capture buffer: %s\n";
  }
  fatalerror(fmt,pcVar3);
}

Assistant:

static void reallocCaptureBuf(void)
{
	if (lexerState->captureCapacity == SIZE_MAX)
		fatalerror("Cannot grow capture buffer past %zu bytes\n", SIZE_MAX);
	else if (lexerState->captureCapacity > SIZE_MAX / 2)
		lexerState->captureCapacity = SIZE_MAX;
	else
		lexerState->captureCapacity *= 2;
	lexerState->captureBuf = (char *)realloc(lexerState->captureBuf, lexerState->captureCapacity);
	if (!lexerState->captureBuf)
		fatalerror("realloc error while resizing capture buffer: %s\n", strerror(errno));
}